

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O1

VkResult volkInitialize(void)

{
  long lVar1;
  VkResult VVar2;
  
  lVar1 = dlopen("libvulkan.so.1",2);
  if (lVar1 == 0) {
    lVar1 = dlopen("libvulkan.so",2);
  }
  if (lVar1 == 0) {
    VVar2 = VK_ERROR_INITIALIZATION_FAILED;
  }
  else {
    vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym(lVar1,"vkGetInstanceProcAddr");
    VVar2 = VK_SUCCESS;
    vkCreateInstance =
         (PFN_vkCreateInstance)(*vkGetInstanceProcAddr)((VkInstance)0x0,"vkCreateInstance");
    vkEnumerateInstanceExtensionProperties =
         (PFN_vkEnumerateInstanceExtensionProperties)
         (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceExtensionProperties");
    vkEnumerateInstanceLayerProperties =
         (PFN_vkEnumerateInstanceLayerProperties)
         (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceLayerProperties");
    vkEnumerateInstanceVersion =
         (PFN_vkEnumerateInstanceVersion)
         (*vkGetInstanceProcAddr)((VkInstance)0x0,"vkEnumerateInstanceVersion");
  }
  return VVar2;
}

Assistant:

VkResult volkInitialize(void)
{
#if defined(_WIN32)
	HMODULE module = LoadLibraryA("vulkan-1.dll");
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	// note: function pointer is cast through void function pointer to silence cast-function-type warning on gcc8
	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)(void(*)(void))GetProcAddress(module, "vkGetInstanceProcAddr");
#elif defined(__APPLE__)
	void* module = dlopen("libvulkan.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libvulkan.1.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libMoltenVK.dylib", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym(module, "vkGetInstanceProcAddr");
#else
	void* module = dlopen("libvulkan.so.1", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		module = dlopen("libvulkan.so", RTLD_NOW | RTLD_LOCAL);
	if (!module)
		return VK_ERROR_INITIALIZATION_FAILED;

	vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)dlsym(module, "vkGetInstanceProcAddr");
#endif

	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);

	return VK_SUCCESS;
}